

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

Option<Kernel::RationalConstantType> * __thiscall
Kernel::FuncId::tryNumeral<Kernel::NumTraits<Kernel::RationalConstantType>>(FuncId *this)

{
  bool bVar1;
  Theory *in_RSI;
  RationalConstantType *in_RDI;
  Numeral out;
  RationalConstantType *this_00;
  RationalConstantType local_30;
  
  this_00 = in_RDI;
  RationalConstantType::RationalConstantType(&local_30);
  bVar1 = Theory::tryInterpretConstant(in_RSI,(uint)((ulong)this_00 >> 0x20),in_RDI);
  if (bVar1) {
    Lib::Option<Kernel::RationalConstantType>::OptionBase
              ((Option<Kernel::RationalConstantType> *)this_00,in_RDI);
  }
  else {
    (in_RDI->_den)._val[0]._mp_alloc = 0;
    (in_RDI->_den)._val[0]._mp_size = 0;
    (in_RDI->_den)._val[0]._mp_d = (mp_limb_t *)0x0;
    (in_RDI->_num)._val[0]._mp_alloc = 0;
    (in_RDI->_num)._val[0]._mp_size = 0;
    (in_RDI->_num)._val[0]._mp_d = (mp_limb_t *)0x0;
    in_RDI[1]._num._val[0]._mp_alloc = 0;
    in_RDI[1]._num._val[0]._mp_size = 0;
    Lib::Option<Kernel::RationalConstantType>::Option
              ((Option<Kernel::RationalConstantType> *)0x8111fd);
  }
  RationalConstantType::~RationalConstantType(this_00);
  return (Option<Kernel::RationalConstantType> *)this_00;
}

Assistant:

Option<typename Number::ConstantType> FuncId::tryNumeral() const
{ 
  using Numeral = typename Number::ConstantType;
  Numeral out;
  if (theory->tryInterpretConstant(_num, out)) {
    return Option<Numeral>(out);
  } else {
    return Option<Numeral>();
  }
}